

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O0

unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
draco::StdioFileReader::Open(string *file_name)

{
  bool bVar1;
  ulong uVar2;
  char *__filename;
  FILE *__stream;
  StdioFileReader *this;
  tuple<draco::FileReaderInterface_*,_std::default_delete<draco::FileReaderInterface>_> in_RDI;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_> file;
  FILE *raw_file_ptr;
  FILE *in_stack_ffffffffffffff98;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_draco::FileReaderInterface_*,_false> this_00;
  
  this_00._M_head_impl =
       (FileReaderInterface *)
       in_RDI.
       super__Tuple_impl<0UL,_draco::FileReaderInterface_*,_std::default_delete<draco::FileReaderInterface>_>
       .super__Head_base<0UL,_draco::FileReaderInterface_*,_false>._M_head_impl;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen64(__filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>::
      unique_ptr<std::default_delete<draco::FileReaderInterface>,void>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      this = (StdioFileReader *)operator_new(0x10,(nothrow_t *)&std::nothrow);
      if (this != (StdioFileReader *)0x0) {
        StdioFileReader(this,in_stack_ffffffffffffff98);
      }
      std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>::
      unique_ptr<std::default_delete<draco::FileReaderInterface>,void>
                ((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                  *)this,(pointer)in_stack_ffffffffffffff98);
      bVar1 = std::operator==((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                               *)this,in_stack_ffffffffffffff98);
      if (bVar1) {
        fprintf(_stderr,"%s:%d (%s): %s.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/io/stdio_file_reader.cc"
                ,0x2c,"Open","Out of memory");
        fclose(__stream);
        std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>
        ::unique_ptr<std::default_delete<draco::FileReaderInterface>,void>
                  ((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                    *)this,in_stack_ffffffffffffff98);
      }
      else {
        std::
        unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>::
        unique_ptr((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                    *)this,(unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                            *)in_stack_ffffffffffffff98);
      }
      std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
      ::~unique_ptr((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                     *)this_00._M_head_impl);
    }
  }
  else {
    std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>::
    unique_ptr<std::default_delete<draco::FileReaderInterface>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_draco::FileReaderInterface_*,_std::default_delete<draco::FileReaderInterface>_>
             .super__Head_base<0UL,_draco::FileReaderInterface_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FileReaderInterface> StdioFileReader::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "rb");

  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<FileReaderInterface> file(new (std::nothrow)
                                                StdioFileReader(raw_file_ptr));
  if (file == nullptr) {
    FILEREADER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

  return file;
}